

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessage::SendToSink(LogMessage *this)

{
  LogMessageData *pLVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  size_t sVar3;
  
  pLVar1 = this->data_;
  pvVar2 = (pLVar1->field_6).outvec_;
  if (pvVar2 != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    sVar3 = pLVar1->num_chars_to_log_;
    if ((sVar3 == 0) || (pLVar1->message_text_[sVar3 - 1] != '\n')) {
      RawLog__(3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x624,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_-1] == \'\\n\'"
               ,"");
      pLVar1 = this->data_;
      pvVar2 = (pLVar1->field_6).outvec_;
      sVar3 = pLVar1->num_chars_to_log_;
    }
    (*(code *)(((pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity)
              (pvVar2,(int)pLVar1->severity_,pLVar1->fullname_,pLVar1->basename_,pLVar1->line_,
               &pLVar1->tm_time_,pLVar1->message_text_ + pLVar1->num_prefix_chars_,
               ~pLVar1->num_prefix_chars_ + sVar3);
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->sink_ != NULL) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
               data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");
    data_->sink_->send(data_->severity_, data_->fullname_, data_->basename_,
                       data_->line_, &data_->tm_time_,
                       data_->message_text_ + data_->num_prefix_chars_,
                       (data_->num_chars_to_log_ -
                        data_->num_prefix_chars_ - 1));
  }
}